

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O1

void concept_suite::iterator_incrementable(void)

{
  bool bVar1;
  iterator_type *this;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> data;
  iterator a;
  circular_view<int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> local_70;
  basic_iterator<int> local_58;
  circular_view<int,_18446744073709551615UL> local_48;
  iterator_type local_28;
  
  local_48.member.data = (pointer)0x160000000b;
  local_48.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_70,__l,(allocator_type *)&local_58);
  local_48.member.data = (pointer)0x0;
  if ((long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_48.member.data =
         local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_48.member.cap =
       (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start >> 2;
  local_58.current = 0;
  local_58.parent = &local_48;
  local_48.member.size = local_48.member.cap;
  local_48.member.next = local_48.member.cap;
  this = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
                   (&local_58);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (this,&local_58);
  boost::detail::test_impl
            ("b == a",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x51,"void concept_suite::iterator_incrementable()",bVar1);
  local_28.current = local_48.member.cap * 2;
  if ((local_28.current & local_48.member.cap * 2 - 1) == 0) {
    local_28.current = local_28.current - 1 & local_48.member.next - local_48.member.size;
  }
  else {
    local_28.current = (local_48.member.next - local_48.member.size) % local_28.current;
  }
  local_28.parent = &local_48;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (this,&local_28);
  boost::detail::test_impl
            ("b != span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x52,"void concept_suite::iterator_incrementable()",!bVar1);
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void iterator_incrementable()
{
    std::vector<int> data = { 11, 22, 33, 44 };
    circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::iterator a = span.begin();
    circular_view<int>::iterator& b = ++a;
    BOOST_TEST(b == a);
    BOOST_TEST(b != span.begin());
}